

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WAsmjsUtils.cpp
# Opt level: O0

uint32 WAsmJs::GetTypeByteSize(Types type)

{
  uint32 local_c;
  Types type_local;
  
  switch(type) {
  case INT32:
    local_c = 4;
    break;
  case INT64:
    local_c = 8;
    break;
  case FLOAT32:
    local_c = 4;
    break;
  case FLOAT64:
    local_c = 8;
    break;
  case SIMD:
    local_c = 0x10;
    break;
  default:
    Js::Throw::InternalError();
  }
  return local_c;
}

Assistant:

uint32 GetTypeByteSize(Types type)
    {
        // Since this needs to be done manually for each type, this assert will make sure to not forget to update this if a new type is added
        CompileAssert(WAsmJs::LIMIT == 5);
        switch (type)
        {
        case INT32  : return sizeof(int32);
        case INT64  : return sizeof(int64);
        case FLOAT32: return sizeof(float);
        case FLOAT64: return sizeof(double);
        case SIMD   : return sizeof(AsmJsSIMDValue);
        default     : break;
        }
        Js::Throw::InternalError();
    }